

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  internal *piVar5;
  TestPartResult *this;
  ostream *poVar6;
  TimeInMillis ms;
  TimeInMillis ms_00;
  char *local_668;
  string local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  undefined1 local_528 [8];
  string detail_1;
  string local_500;
  string local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  undefined1 local_4a0 [8];
  string summary_1;
  string location_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  undefined1 local_420 [8];
  string detail;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  undefined1 local_3c0 [8];
  string summary;
  string location;
  TestPartResult *part;
  int i;
  int skips;
  int failures;
  allocator local_341;
  string local_340;
  string local_320;
  allocator local_2f9;
  string local_2f8;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  int local_1ec;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  undefined4 local_60;
  allocator local_49;
  undefined1 local_48 [8];
  string kTestsuite;
  TestResult *result;
  TestInfo *test_info_local;
  char *test_suite_name_local;
  ostream *stream_local;
  
  kTestsuite.field_2._8_8_ = TestInfo::result(test_info);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,"testcase",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  bVar1 = TestInfo::is_in_another_shard(test_info);
  if (bVar1) {
    local_60 = 1;
  }
  else {
    std::operator<<(stream,"    <testcase");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"name",&local_81);
    pcVar4 = TestInfo::name(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a8,pcVar4,&local_a9);
    OutputXmlAttribute(stream,(string *)local_48,&local_80,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    pcVar4 = TestInfo::value_param(test_info);
    if (pcVar4 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,"value_param",&local_d1);
      pcVar4 = TestInfo::value_param(test_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f8,pcVar4,&local_f9);
      OutputXmlAttribute(stream,(string *)local_48,&local_d0,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
    pcVar4 = TestInfo::type_param(test_info);
    if (pcVar4 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_120,"type_param",&local_121);
      pcVar4 = TestInfo::type_param(test_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_148,pcVar4,&local_149);
      OutputXmlAttribute(stream,(string *)local_48,&local_120,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
    }
    if ((FLAGS_gtest_list_tests & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_210,"status",&local_211);
      bVar1 = TestInfo::should_run(test_info);
      pcVar4 = "notrun";
      if (bVar1) {
        pcVar4 = "run";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_238,pcVar4,&local_239);
      OutputXmlAttribute(stream,(string *)local_48,&local_210,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator((allocator<char> *)&local_239);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_260,"result",&local_261);
      bVar1 = TestInfo::should_run(test_info);
      if (bVar1) {
        bVar1 = TestResult::Skipped((TestResult *)kTestsuite.field_2._8_8_);
        local_668 = "completed";
        if (bVar1) {
          local_668 = "skipped";
        }
      }
      else {
        local_668 = "suppressed";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_288,local_668,&local_289);
      OutputXmlAttribute(stream,(string *)local_48,&local_260,&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator((allocator<char> *)&local_261);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2b0,"time",&local_2b1);
      piVar5 = (internal *)TestResult::elapsed_time((TestResult *)kTestsuite.field_2._8_8_);
      FormatTimeInMillisAsSeconds_abi_cxx11_(&local_2d8,piVar5,ms);
      OutputXmlAttribute(stream,(string *)local_48,&local_2b0,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2f8,"timestamp",&local_2f9);
      piVar5 = (internal *)TestResult::start_timestamp((TestResult *)kTestsuite.field_2._8_8_);
      FormatEpochTimeInMillisAsIso8601_abi_cxx11_(&local_320,piVar5,ms_00);
      OutputXmlAttribute(stream,(string *)local_48,&local_2f8,&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_340,"classname",&local_341);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&failures,test_suite_name,(allocator *)((long)&skips + 3));
      OutputXmlAttribute(stream,(string *)local_48,&local_340,(string *)&failures);
      std::__cxx11::string::~string((string *)&failures);
      std::allocator<char>::~allocator((allocator<char> *)((long)&skips + 3));
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
      i = 0;
      part._4_4_ = 0;
      for (part._0_4_ = 0;
          iVar2 = TestResult::total_part_count((TestResult *)kTestsuite.field_2._8_8_),
          (int)part < iVar2; part._0_4_ = (int)part + 1) {
        this = TestResult::GetTestPartResult((TestResult *)kTestsuite.field_2._8_8_,(int)part);
        bVar1 = TestPartResult::failed(this);
        if (bVar1) {
          i = i + 1;
          if ((i == 1) && (part._4_4_ == 0)) {
            std::operator<<(stream,">\n");
          }
          piVar5 = (internal *)TestPartResult::file_name(this);
          uVar3 = TestPartResult::line_number(this);
          FormatCompilerIndependentFileLocation_abi_cxx11_
                    ((string *)((long)&summary.field_2 + 8),piVar5,(char *)(ulong)uVar3,iVar2);
          std::operator+(&local_3e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&summary.field_2 + 8),"\n");
          pcVar4 = TestPartResult::summary(this);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3c0,&local_3e0,pcVar4);
          std::__cxx11::string::~string((string *)&local_3e0);
          poVar6 = std::operator<<(stream,"      <failure message=\"");
          EscapeXmlAttribute((string *)((long)&detail.field_2 + 8),(string *)local_3c0);
          poVar6 = std::operator<<(poVar6,(string *)(detail.field_2._M_local_buf + 8));
          std::operator<<(poVar6,"\" type=\"\">");
          std::__cxx11::string::~string((string *)(detail.field_2._M_local_buf + 8));
          std::operator+(&local_440,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&summary.field_2 + 8),"\n");
          pcVar4 = TestPartResult::message(this);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_420,&local_440,pcVar4);
          std::__cxx11::string::~string((string *)&local_440);
          RemoveInvalidXmlCharacters((string *)((long)&location_1.field_2 + 8),(string *)local_420);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          OutputXmlCDataSection(stream,pcVar4);
          std::__cxx11::string::~string((string *)(location_1.field_2._M_local_buf + 8));
          std::operator<<(stream,"</failure>\n");
          std::__cxx11::string::~string((string *)local_420);
          std::__cxx11::string::~string((string *)local_3c0);
          std::__cxx11::string::~string((string *)(summary.field_2._M_local_buf + 8));
        }
        else {
          bVar1 = TestPartResult::skipped(this);
          if (bVar1) {
            part._4_4_ = part._4_4_ + 1;
            if ((part._4_4_ == 1) && (i == 0)) {
              std::operator<<(stream,">\n");
            }
            piVar5 = (internal *)TestPartResult::file_name(this);
            uVar3 = TestPartResult::line_number(this);
            FormatCompilerIndependentFileLocation_abi_cxx11_
                      ((string *)((long)&summary_1.field_2 + 8),piVar5,(char *)(ulong)uVar3,iVar2);
            std::operator+(&local_4c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&summary_1.field_2 + 8),"\n");
            pcVar4 = TestPartResult::summary(this);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4a0,&local_4c0,pcVar4);
            std::__cxx11::string::~string((string *)&local_4c0);
            poVar6 = std::operator<<(stream,"      <skipped message=\"");
            pcVar4 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_500,pcVar4,
                       (allocator *)(detail_1.field_2._M_local_buf + 0xf));
            EscapeXmlAttribute(&local_4e0,&local_500);
            poVar6 = std::operator<<(poVar6,(string *)&local_4e0);
            std::operator<<(poVar6,"\">");
            std::__cxx11::string::~string((string *)&local_4e0);
            std::__cxx11::string::~string((string *)&local_500);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(detail_1.field_2._M_local_buf + 0xf));
            std::operator+(&local_548,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&summary_1.field_2 + 8),"\n");
            pcVar4 = TestPartResult::message(this);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_528,&local_548,pcVar4);
            std::__cxx11::string::~string((string *)&local_548);
            RemoveInvalidXmlCharacters(&local_568,(string *)local_528);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            OutputXmlCDataSection(stream,pcVar4);
            std::__cxx11::string::~string((string *)&local_568);
            std::operator<<(stream,"</skipped>\n");
            std::__cxx11::string::~string((string *)local_528);
            std::__cxx11::string::~string((string *)local_4a0);
            std::__cxx11::string::~string((string *)(summary_1.field_2._M_local_buf + 8));
          }
        }
      }
      if (((i == 0) && (part._4_4_ == 0)) &&
         (iVar2 = TestResult::test_property_count((TestResult *)kTestsuite.field_2._8_8_),
         iVar2 == 0)) {
        std::operator<<(stream," />\n");
      }
      else {
        if ((i == 0) && (part._4_4_ == 0)) {
          std::operator<<(stream,">\n");
        }
        OutputXmlTestProperties(stream,(TestResult *)kTestsuite.field_2._8_8_);
        std::operator<<(stream,"    </testcase>\n");
      }
      local_60 = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_170,"file",&local_171);
      pcVar4 = TestInfo::file(test_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_198,pcVar4,&local_199);
      OutputXmlAttribute(stream,(string *)local_48,&local_170,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c0,"line",&local_1c1);
      local_1ec = TestInfo::line(test_info);
      StreamableToString<int>(&local_1e8,&local_1ec);
      OutputXmlAttribute(stream,(string *)local_48,&local_1c0,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      std::operator<<(stream," />\n");
      local_60 = 1;
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_suite_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";

  if (test_info.is_in_another_shard()) {
    return;
  }

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestsuite, "name", test_info.name());

  if (test_info.value_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "type_param",
                       test_info.type_param());
  }
  if (GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "file", test_info.file());
    OutputXmlAttribute(stream, kTestsuite, "line",
                       StreamableToString(test_info.line()));
    *stream << " />\n";
    return;
  }

  OutputXmlAttribute(stream, kTestsuite, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestsuite, "result",
                     test_info.should_run()
                         ? (result.Skipped() ? "skipped" : "completed")
                         : "suppressed");
  OutputXmlAttribute(stream, kTestsuite, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, kTestsuite, "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));
  OutputXmlAttribute(stream, kTestsuite, "classname", test_suite_name);

  int failures = 0;
  int skips = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1 && skips == 0) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary)
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    } else if (part.skipped()) {
      if (++skips == 1 && failures == 0) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <skipped message=\""
              << EscapeXmlAttribute(summary.c_str()) << "\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</skipped>\n";
    }
  }

  if (failures == 0 && skips == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0 && skips == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result);
    *stream << "    </testcase>\n";
  }
}